

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_CutCreateUnit(Mf_Cut_t *p,int i)

{
  int i_local;
  Mf_Cut_t *p_local;
  
  p->Delay = 0;
  p->Flow = 0.0;
  *(uint *)&p->field_0x10 = *(uint *)&p->field_0x10 & 0xf8000000 | 2;
  *(uint *)&p->field_0x10 = *(uint *)&p->field_0x10 & 0x7ffffff | 0x8000000;
  p->pLeaves[0] = i;
  p->Sign = 1L << ((byte)i & 0x3f);
  return 1;
}

Assistant:

static inline int Mf_CutCreateUnit( Mf_Cut_t * p, int i )
{
    p->Delay      = 0;
    p->Flow       = 0;
    p->iFunc      = 2;
    p->nLeaves    = 1;
    p->pLeaves[0] = i;
    p->Sign       = ((word)1) << (i & 0x3F);
    return 1;
}